

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.hpp
# Opt level: O0

void __thiscall jsonip::semantic_state::new_null(semantic_state *this)

{
  helper *phVar1;
  reference pvVar2;
  semantic_state *this_local;
  
  pre(this);
  pvVar2 = std::
           vector<std::pair<jsonip::holder,_const_jsonip::helper_*>,_std::allocator<std::pair<jsonip::holder,_const_jsonip::helper_*>_>_>
           ::back(&this->state);
  phVar1 = pvVar2->second;
  pvVar2 = std::
           vector<std::pair<jsonip::holder,_const_jsonip::helper_*>,_std::allocator<std::pair<jsonip::holder,_const_jsonip::helper_*>_>_>
           ::back(&this->state);
  (*phVar1->_vptr_helper[5])(phVar1,pvVar2);
  post(this);
  return;
}

Assistant:

void new_null()
        {
            pre();
            state.back().second->new_null(state.back().first);
            post();
        }